

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particle_filter.cpp
# Opt level: O3

void __thiscall
ParticleFilter::dataAssociation
          (ParticleFilter *this,
          vector<LandmarkObs,_std::allocator<LandmarkObs>_> *map_landmarks_in_range,
          vector<LandmarkObs,_std::allocator<LandmarkObs>_> *observations_in_map_coordinates)

{
  pointer pLVar1;
  double *pdVar2;
  long lVar3;
  pointer pLVar4;
  ulong uVar5;
  ulong uVar6;
  int map_index;
  ulong unaff_R15;
  double dVar7;
  double dVar8;
  vector<LandmarkObs,_std::allocator<LandmarkObs>_> result;
  vector<LandmarkObs,_std::allocator<LandmarkObs>_> local_68;
  LandmarkObs local_48;
  
  local_68.super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>._M_impl.
  super__Vector_impl_data._M_finish = (LandmarkObs *)0x0;
  local_68.super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (LandmarkObs *)0x0;
  pLVar4 = (observations_in_map_coordinates->
           super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((observations_in_map_coordinates->
      super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>)._M_impl.super__Vector_impl_data
      ._M_finish != pLVar4) {
    uVar6 = 0;
    do {
      pLVar1 = (map_landmarks_in_range->
               super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar3 = (long)(map_landmarks_in_range->
                    super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>)._M_impl.
                    super__Vector_impl_data._M_finish - (long)pLVar1;
      if (lVar3 == 0) {
        local_48.x = pLVar4[uVar6].x;
        local_48.y = (&pLVar4[uVar6].x)[1];
      }
      else {
        lVar3 = (lVar3 >> 3) * -0x5555555555555555;
        local_48.x = pLVar4[uVar6].x;
        local_48.y = (&pLVar4[uVar6].x)[1];
        pdVar2 = &pLVar1->y;
        uVar5 = 0;
        dVar7 = 1e+99;
        do {
          dVar8 = (pdVar2[-1] - local_48.x) * (pdVar2[-1] - local_48.x) +
                  (*pdVar2 - local_48.y) * (*pdVar2 - local_48.y);
          if (dVar8 < dVar7) {
            unaff_R15 = uVar5;
            dVar7 = dVar8;
          }
          unaff_R15 = unaff_R15 & 0xffffffff;
          uVar5 = uVar5 + 1;
          pdVar2 = pdVar2 + 3;
        } while (lVar3 + (ulong)(lVar3 == 0) != uVar5);
      }
      local_48.id = (int)unaff_R15;
      if (local_68.super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_68.super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<LandmarkObs,std::allocator<LandmarkObs>>::_M_realloc_insert<LandmarkObs_const&>
                  ((vector<LandmarkObs,std::allocator<LandmarkObs>> *)&local_68,
                   (iterator)
                   local_68.super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>._M_impl.
                   super__Vector_impl_data._M_finish,&local_48);
      }
      else {
        (local_68.super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>._M_impl.
         super__Vector_impl_data._M_finish)->y = local_48.y;
        *(ulong *)local_68.super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>._M_impl.
                  super__Vector_impl_data._M_finish = CONCAT44(local_48._4_4_,local_48.id);
        (local_68.super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>._M_impl.
         super__Vector_impl_data._M_finish)->x = local_48.x;
        local_68.super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_68.super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      uVar6 = uVar6 + 1;
      pLVar4 = (observations_in_map_coordinates->
               super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar5 = ((long)(observations_in_map_coordinates->
                     super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>)._M_impl.
                     super__Vector_impl_data._M_finish - (long)pLVar4 >> 3) * -0x5555555555555555;
    } while (uVar6 <= uVar5 && uVar5 - uVar6 != 0);
  }
  std::vector<LandmarkObs,_std::allocator<LandmarkObs>_>::operator=
            (observations_in_map_coordinates,&local_68);
  if (local_68.super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void ParticleFilter::dataAssociation(std::vector<LandmarkObs> map_landmarks_in_range, std::vector<LandmarkObs>& observations_in_map_coordinates) 
{
  std::vector<LandmarkObs> result;
  for (int i=0; i<observations_in_map_coordinates.size(); i++)
  {
    int map_index;
    double dist_comp = 1.0e99;
    for (int j=0; j<map_landmarks_in_range.size(); j++)
    {
      double delta_x = map_landmarks_in_range[j].x - observations_in_map_coordinates[i].x;
      double delta_y = map_landmarks_in_range[j].y - observations_in_map_coordinates[i].y;
      double d = delta_x * delta_x + delta_y * delta_y; 
      if (d < dist_comp)
      {
        map_index = j;
        dist_comp = d;
      } 
    }
    LandmarkObs l = {map_index, observations_in_map_coordinates[i].x, observations_in_map_coordinates[i].y};
    result.push_back(l);
  }
  observations_in_map_coordinates = result;
}